

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O3

bool filesystem::create_subdirectory(path *p)

{
  bool bVar1;
  __mode_t __mask;
  int iVar2;
  __normal_iterator<filesystem::path_*,_std::vector<filesystem::path,_std::allocator<filesystem::path>_>_>
  __tmp;
  pointer this;
  vector<filesystem::path,_std::allocator<filesystem::path>_> hierarchy;
  path tmp;
  vector<filesystem::path,_std::allocator<filesystem::path>_> local_98;
  undefined1 local_80 [40];
  path local_58;
  
  local_58.m_type = p->m_type;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_58.m_path,&p->m_path);
  local_58.m_absolute = p->m_absolute;
  bVar1 = true;
  local_98.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_start = (path *)0x0;
  local_98.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_finish = (path *)0x0;
  if (local_58.m_path.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.m_path.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::vector<filesystem::path,_std::allocator<filesystem::path>_>::push_back
                (&local_98,&local_58);
      path::parent_path((path *)local_80,&local_58);
      path::operator=(&local_58,(path *)local_80);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_80 + 8));
    } while (local_58.m_path.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_58.m_path.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (local_98.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_98.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this = local_98.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>.
             _M_impl.super__Vector_impl_data._M_finish;
      do {
        this = this + -1;
        bVar1 = path::exists(this);
        if (!bVar1) {
          bVar1 = path::is_directory(this);
          if (!bVar1) {
            __mask = umask(0);
            path::str_abi_cxx11_((string *)local_80,this,native_path);
            iVar2 = mkdir((char *)local_80._0_8_,0x1ff);
            if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
              operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
            }
            umask(__mask);
            if (iVar2 != 0) {
              bVar1 = false;
              goto LAB_0010639d;
            }
          }
        }
      } while (this != local_98.
                       super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>.
                       _M_impl.super__Vector_impl_data._M_start);
      bVar1 = true;
    }
  }
LAB_0010639d:
  std::vector<filesystem::path,_std::allocator<filesystem::path>_>::~vector(&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58.m_path);
  return bVar1;
}

Assistant:

inline bool create_subdirectory(const path& p) {
    auto tmp = p;
    std::vector<path> hierarchy;
    while (!tmp.empty()) {
        hierarchy.push_back(tmp);
        tmp = tmp.parent_path();
    }

    for (auto ancestor = hierarchy.rbegin(); ancestor != hierarchy.rend(); ++ancestor) {
        if (ancestor->exists())
            continue;
        if (!create_directory(*ancestor))
            return false;
    }

    return true;
}